

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

void __thiscall
jsoncons::jmespath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::destroy
          (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this)

{
  if (this->type_ == literal) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
              (&(this->field_2).value_);
  }
  return;
}

Assistant:

void destroy() noexcept 
        {
            switch(type_)
            {
                case token_kind::literal:
                    value_.~Json();
                    break;
                default:
                    break;
            }
        }